

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O0

int luaB_load(lua_State *L)

{
  int iVar1;
  int envidx;
  char *pcVar2;
  char *mode_00;
  char *name;
  char *chunkname_1;
  char *chunkname;
  int env;
  char *mode;
  char *s;
  size_t l;
  lua_State *plStack_10;
  int status;
  lua_State *L_local;
  
  plStack_10 = L;
  pcVar2 = lua_tolstring(L,1,(size_t *)&s);
  mode_00 = getMode(plStack_10,3);
  iVar1 = lua_type(plStack_10,4);
  envidx = 0;
  if (iVar1 != -1) {
    envidx = 4;
  }
  if (pcVar2 == (char *)0x0) {
    pcVar2 = luaL_optlstring(plStack_10,2,"=(load)",(size_t *)0x0);
    luaL_checktype(plStack_10,1,6);
    lua_settop(plStack_10,5);
    l._4_4_ = lua_load(plStack_10,generic_reader,(void *)0x0,pcVar2,mode_00);
  }
  else {
    name = luaL_optlstring(plStack_10,2,pcVar2,(size_t *)0x0);
    l._4_4_ = luaL_loadbufferx(plStack_10,pcVar2,(size_t)s,name,mode_00);
  }
  iVar1 = load_aux(plStack_10,l._4_4_,envidx);
  return iVar1;
}

Assistant:

static int luaB_load (lua_State *L) {
  int status;
  size_t l;
  const char *s = lua_tolstring(L, 1, &l);
  const char *mode = getMode(L, 3);
  int env = (!lua_isnone(L, 4) ? 4 : 0);  /* 'env' index or 0 if no 'env' */
  if (s != NULL) {  /* loading a string? */
    const char *chunkname = luaL_optstring(L, 2, s);
    status = luaL_loadbufferx(L, s, l, chunkname, mode);
  }
  else {  /* loading from a reader function */
    const char *chunkname = luaL_optstring(L, 2, "=(load)");
    luaL_checktype(L, 1, LUA_TFUNCTION);
    lua_settop(L, RESERVEDSLOT);  /* create reserved slot */
    status = lua_load(L, generic_reader, NULL, chunkname, mode);
  }
  return load_aux(L, status, env);
}